

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_change_cipher_spec(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  int iVar1;
  ulong body_size_00;
  size_t body_size;
  size_t local_30;
  size_t body_start;
  size_t capacity;
  ptls_message_emitter_t *ppStack_18;
  int ret;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  if (((byte)tls->field_0x1e8 >> 2 & 1) == 0) {
    capacity._4_4_ = 0;
  }
  else if (emitter->begin_message == begin_record_message) {
    capacity._1_1_ = 0x14;
    capacity._2_1_ = 3;
    capacity._3_1_ = 3;
    ppStack_18 = emitter;
    emitter_local = (ptls_message_emitter_t *)tls;
    capacity._4_4_ = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity + 1),3);
    if (capacity._4_4_ == 0) {
      body_start = 2;
      capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18->buf,"",2);
      if (capacity._4_4_ == 0) {
        local_30 = ppStack_18->buf->off;
        body_size._7_1_ = 1;
        capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18->buf,(void *)((long)&body_size + 7),1);
        if (capacity._4_4_ == 0) {
          body_size_00 = ppStack_18->buf->off - local_30;
          if (body_start == 0xffffffffffffffff) {
            iVar1 = ptls_buffer__adjust_quic_blocksize(ppStack_18->buf,body_size_00);
            if (iVar1 != 0) {
              return iVar1;
            }
          }
          else {
            if ((body_start < 8) &&
               ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= body_size_00)) {
              return 0x20c;
            }
            for (; body_start != 0; body_start = body_start - 1) {
              ppStack_18->buf->base[local_30 - body_start] =
                   (uint8_t)(body_size_00 >> (((char)body_start + -1) * '\b' & 0x3fU));
            }
          }
          *(byte *)&emitter_local[0xc].enc = *(byte *)&emitter_local[0xc].enc & 0xfb;
          capacity._4_4_ = 0;
        }
      }
    }
  }
  else {
    capacity._4_4_ = 10;
  }
  return capacity._4_4_;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    /* check if we are requested to (or still need to) */
    if (!tls->send_change_cipher_spec) {
        ret = 0;
        goto Exit;
    }

    /* CCS is a record, can only be sent when using a record-based protocol. */
    if (emitter->begin_message != begin_record_message) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* emit CCS */
    buffer_push_record(emitter->buf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(emitter->buf, 1); });

    tls->send_change_cipher_spec = 0;
    ret = 0;
Exit:
    return ret;
}